

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image * rf_image_copy(rf_image image,rf_allocator allocator)

{
  rf_image image_00;
  rf_source_location source_location;
  int iVar1;
  void *dst;
  code *in_RDX;
  uint uVar2;
  rf_image *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  char cStack000000000000001c;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  uint uStack_8c;
  undefined1 local_70 [16];
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->format = 0;
  in_RDI->valid = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  if (cStack000000000000001c == '\x01') {
    iVar1 = 0;
    if (in_stack_00000018 - 1U < 10) {
      iVar1 = *(int *)(&DAT_0017a7c8 + (ulong)(in_stack_00000018 - 1U) * 4);
    }
    uVar2 = in_stack_00000014 * in_stack_00000010 * iVar1;
    lVar5 = (ulong)uStack_8c << 0x20;
    uVar3 = 0;
    lVar4 = (long)(int)uVar2;
    dst = (void *)(*in_RDX)(local_70,1);
    if (dst == (void *)0x0) {
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_40 = "rf_image_copy";
      local_38 = 0x3d77;
      source_location.proc_name._0_4_ = 0x17b0d0;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3d77;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Failed to allocate %d bytes",2,(ulong)uVar2,
                  in_R8,in_R9,uVar3,lVar4,lVar5);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_copy";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d77;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
    }
    else {
      image_00._20_4_ = _cStack000000000000001c;
      image_00.format = in_stack_00000018;
      image_00.width = in_stack_00000010;
      image_00.data = (void *)in_stack_00000008;
      image_00.height = in_stack_00000014;
      rf_image_copy_to_buffer(in_RDI,image_00,dst,(long)(int)uVar2);
    }
  }
  else {
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_58 = "rf_image_copy";
    local_50 = 0x3d79;
    rf_log_impl(8,0x17b0bd,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_copy";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d79;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_image_copy(rf_image image, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        int size  = image.width * image.height * rf_bytes_per_pixel(image.format);
        void* dst = RF_ALLOC(allocator, size);

        if (dst)
        {
            result = rf_image_copy_to_buffer(image, dst, size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Failed to allocate %d bytes", size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image was invalid.");

    return result;
}